

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  float items_height_00;
  float items_height;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiListClipper *this_local;
  
  pIVar1 = GImGui->CurrentWindow;
  if ((this->ItemsCount == 0) || ((pIVar1->SkipItems & 1U) != 0)) {
    this->ItemsCount = -1;
    this_local._7_1_ = false;
  }
  else if (this->StepNo == 0) {
    this->DisplayStart = 0;
    this->DisplayEnd = 1;
    this->StartPosY = (pIVar1->DC).CursorPos.y;
    this->StepNo = 1;
    this_local._7_1_ = true;
  }
  else if (this->StepNo == 1) {
    if (this->ItemsCount == 1) {
      this->ItemsCount = -1;
      this_local._7_1_ = false;
    }
    else {
      items_height_00 = (pIVar1->DC).CursorPos.y - this->StartPosY;
      if (items_height_00 <= 0.0) {
        __assert_fail("items_height > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui.cpp"
                      ,0x92d,"bool ImGuiListClipper::Step()");
      }
      Begin(this,this->ItemsCount + -1,items_height_00);
      this->DisplayStart = this->DisplayStart + 1;
      this->DisplayEnd = this->DisplayEnd + 1;
      this->StepNo = 3;
      this_local._7_1_ = true;
    }
  }
  else if (this->StepNo == 2) {
    bVar2 = false;
    if (-1 < this->DisplayStart) {
      bVar2 = -1 < this->DisplayEnd;
    }
    if (!bVar2) {
      __assert_fail("DisplayStart >= 0 && DisplayEnd >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/imgui/src/imgui.cpp"
                    ,0x936,"bool ImGuiListClipper::Step()");
    }
    this->StepNo = 3;
    this_local._7_1_ = true;
  }
  else {
    if (this->StepNo == 3) {
      End(this);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ImGuiListClipper::Step()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (ItemsCount == 0 || window->SkipItems)
    {
        ItemsCount = -1;
        return false;
    }
    if (StepNo == 0) // Step 0: the clipper let you process the first element, regardless of it being visible or not, so we can measure the element height.
    {
        DisplayStart = 0;
        DisplayEnd = 1;
        StartPosY = window->DC.CursorPos.y;
        StepNo = 1;
        return true;
    }
    if (StepNo == 1) // Step 1: the clipper infer height from first element, calculate the actual range of elements to display, and position the cursor before the first element.
    {
        if (ItemsCount == 1) { ItemsCount = -1; return false; }
        float items_height = window->DC.CursorPos.y - StartPosY;
        IM_ASSERT(items_height > 0.0f);   // If this triggers, it means Item 0 hasn't moved the cursor vertically
        Begin(ItemsCount - 1, items_height);
        DisplayStart++;
        DisplayEnd++;
        StepNo = 3;
        return true;
    }
    if (StepNo == 2) // Step 2: dummy step only required if an explicit items_height was passed to constructor or Begin() and user still call Step(). Does nothing and switch to Step 3.
    {
        IM_ASSERT(DisplayStart >= 0 && DisplayEnd >= 0);
        StepNo = 3;
        return true;
    }
    if (StepNo == 3) // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd), advance the cursor to the end of the list and then returns 'false' to end the loop.
        End();
    return false;
}